

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::SizeAtCapacity(RepeatedPtrFieldBase *this)

{
  int v2;
  int iVar1;
  string *psVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pcVar5;
  LogMessageFatal local_20 [16];
  
  iVar1 = this->current_size_;
  v2 = allocated_size(this);
  psVar2 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                     (iVar1,v2,"size() <= allocated_size()");
  if (psVar2 == (string *)0x0) {
    iVar1 = allocated_size(this);
    psVar2 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar1,this->capacity_proxy_ + 1,"allocated_size() <= Capacity()");
    if (psVar2 == (string *)0x0) {
      return this->capacity_proxy_ < this->current_size_;
    }
    pcVar5 = (psVar2->_M_dataplus)._M_p;
    sVar3 = psVar2->_M_string_length;
    uVar4 = 0x260;
  }
  else {
    pcVar5 = (psVar2->_M_dataplus)._M_p;
    sVar3 = psVar2->_M_string_length;
    uVar4 = 0x25f;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,uVar4,sVar3,pcVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

inline bool SizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This is equivalent to `current_size_ == Capacity()`.
    // Assuming `Capacity()` function is inlined, compiler is likely to optimize
    // away "+ kSSOCapacity" and reduce it to "current_size_ > capacity_proxy_"
    // which is an instruction less than "current_size_ == capacity_proxy_ + 1".
    return current_size_ >= Capacity();
  }